

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
               (int iters,vector<int,_std::allocator<int>_> *indices,char *title)

{
  bool bVar1;
  data_type *pdVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  int in_EDI;
  double ut;
  int i;
  int r;
  Rusage t;
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> set;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  HashObject<16,_16> *in_stack_fffffffffffffef0;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  iterator local_f0;
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *in_stack_ffffffffffffff30;
  dense_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_c8;
  int local_9c;
  uint local_98;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  double in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            (in_stack_ffffffffffffff30);
  Rusage::Rusage((Rusage *)in_stack_fffffffffffffef0);
  for (local_9c = 0; local_9c < in_EDI; local_9c = local_9c + 1) {
    in_stack_ffffffffffffff04 = local_9c + 1;
    HashObject<16,_16>::HashObject(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    pdVar2 = google::
             dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
             ::operator[]((dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                           *)in_stack_fffffffffffffef0,
                          (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
    ;
    *pdVar2 = in_stack_ffffffffffffff04;
  }
  local_98 = 1;
  Rusage::Reset((Rusage *)in_stack_fffffffffffffef0);
  for (local_9c = 0; local_9c < in_EDI; local_9c = local_9c + 1) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_9c);
    HashObject<16,_16>::HashObject(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
    google::
    dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::find((dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)in_stack_fffffffffffffef0,
           (key_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    google::
    dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::end((dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)in_stack_fffffffffffffef0);
    bVar1 = google::
            dense_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            ::operator!=(&local_c8,&local_f0);
    local_98 = bVar1 ^ local_98;
  }
  Rusage::UserTime((Rusage *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  srand(local_98);
  report(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
         in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::~EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)0x1dce77);
  return;
}

Assistant:

static void time_map_fetch(int iters, const vector<int>& indices,
                           char const* title) {
  MapType set;
  Rusage t;
  int r;
  int i;

  for (i = 0; i < iters; i++) {
    set[i] = i + 1;
  }

  r = 1;
  t.Reset();
  for (i = 0; i < iters; i++) {
    r ^= static_cast<int>(set.find(indices[i]) != set.end());
  }
  double ut = t.UserTime();

  srand(r);  // keep compiler from optimizing away r (we never call rand())
  report(title, ut, iters, 0, 0);
}